

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O0

void l2_parse_formal_param_list(l2_scope *scope_p,l2_vector *expr_info_vec_p)

{
  undefined8 *puVar1;
  l2_symbol symbol_00;
  boolean bVar2;
  undefined4 *puVar3;
  boolean add_symbol_result;
  l2_expr_info real_expr_info;
  undefined4 local_48;
  undefined4 uStack_44;
  l2_symbol symbol;
  l2_token *plStack_20;
  int symbol_pos;
  l2_token *current_token_p;
  l2_vector *expr_info_vec_p_local;
  l2_scope *scope_p_local;
  
  plStack_20 = l2_parse_token_current();
  symbol.u._12_4_ = 0;
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_IDENTIFIER);
  if (bVar2 != '\0') {
    l2_parse_token_forward();
    plStack_20 = l2_parse_token_current();
    if (expr_info_vec_p->size <= (ulong)(long)(int)symbol.u._12_4_) {
      bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_IDENTIFIER);
      if (bVar2 != '\0') {
        l2_parse_token_forward();
        l2_parsing_error(L2_PARSING_ERROR_TOO_FEW_PARAMETERS,plStack_20->current_line,
                         plStack_20->current_col);
      }
      bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RP);
      if (bVar2 == '\0') {
        return;
      }
      l2_parse_token_forward();
      l2_parsing_error(L2_PARSING_ERROR_TOO_FEW_PARAMETERS,plStack_20->current_line,
                       plStack_20->current_col);
    }
    puVar3 = (undefined4 *)l2_vector_at(expr_info_vec_p,symbol.u._12_4_);
    puVar1 = (undefined8 *)(puVar3 + 2);
    switch(*puVar3) {
    case 1:
      l2_parsing_error(L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE,plStack_20->current_line,
                       plStack_20->current_col);
    case 2:
      local_48 = 2;
      symbol.symbol_name = (char *)CONCAT44(symbol.symbol_name._4_4_,*(undefined4 *)puVar1);
      break;
    case 3:
      local_48 = 3;
      symbol.symbol_name = (char *)*puVar1;
      break;
    case 4:
      local_48 = 4;
      real_expr_info.val_type._0_1_ = (undefined1)*(undefined4 *)puVar1;
      symbol.symbol_name =
           (char *)CONCAT71(symbol.symbol_name._1_7_,(undefined1)real_expr_info.val_type);
      break;
    case 5:
      local_48 = 5;
      symbol.symbol_name = (char *)*puVar1;
      symbol.u.real = *(double *)(puVar3 + 4);
    }
    symbol._0_8_ = (plStack_20->u).c_str;
    symbol_00._4_4_ = uStack_44;
    symbol_00.type = local_48;
    symbol_00.symbol_name = (char *)symbol._0_8_;
    symbol_00.u.real = (double)symbol.symbol_name;
    symbol_00.u._8_8_ = symbol.u.real;
    bVar2 = l2_symbol_table_add_symbol(&scope_p->symbol_table_p,symbol_00);
    if (bVar2 == '\0') {
      l2_parsing_error(L2_PARSING_ERROR_IDENTIFIER_REDEFINED,plStack_20->current_line,
                       plStack_20->current_col,(plStack_20->u).c_str);
    }
    symbol.u._12_4_ = symbol.u._12_4_ + 1;
    l2_parse_formal_param_list1(scope_p,expr_info_vec_p,(int *)((long)&symbol.u + 0xc));
  }
  if (expr_info_vec_p->size <= (ulong)(long)(int)symbol.u._12_4_) {
    return;
  }
  l2_parsing_error(L2_PARSING_ERROR_TOO_MANY_PARAMETERS,plStack_20->current_line,
                   plStack_20->current_col);
}

Assistant:

void l2_parse_formal_param_list(l2_scope *scope_p, l2_vector *expr_info_vec_p) {
    _declr_current_token_p
    _get_current_token_p
    int symbol_pos = 0;

    _if_type (L2_TOKEN_IDENTIFIER)
    {
        _get_current_token_p
        if (symbol_pos < expr_info_vec_p->size) {

            l2_symbol symbol;

            l2_expr_info real_expr_info = *(l2_expr_info *)l2_vector_at(expr_info_vec_p, symbol_pos);

            switch (real_expr_info.val_type) {
                case L2_EXPR_VAL_TYPE_BOOL:
                    symbol.type = L2_SYMBOL_TYPE_BOOL;
                    symbol.u.bool = real_expr_info.val.bool;
                    break;

                case L2_EXPR_VAL_TYPE_INTEGER:
                    symbol.type = L2_SYMBOL_TYPE_INTEGER;
                    symbol.u.integer = real_expr_info.val.integer;
                    break;

                case L2_EXPR_VAL_TYPE_REAL:
                    symbol.type = L2_SYMBOL_TYPE_REAL;
                    symbol.u.real = real_expr_info.val.real;
                    break;

                case L2_EXPR_VAL_TYPE_PROCEDURE:
                    symbol.type = L2_SYMBOL_TYPE_PROCEDURE;
                    symbol.u.procedure = real_expr_info.val.procedure;
                    break;

                case L2_EXPR_VAL_NO_VAL:
                    l2_parsing_error(L2_PARSING_ERROR_EXPR_RESULT_WITHOUT_VALUE, current_token_p->current_line, current_token_p->current_col);
            }

            symbol.symbol_name = current_token_p->u.str.str_p;

            boolean add_symbol_result = l2_symbol_table_add_symbol(&scope_p->symbol_table_p, symbol);

            if (!add_symbol_result) {
                l2_parsing_error(L2_PARSING_ERROR_IDENTIFIER_REDEFINED, current_token_p->current_line, current_token_p->current_col, current_token_p->u.str.str_p);
            }

            symbol_pos += 1;
            l2_parse_formal_param_list1(scope_p, expr_info_vec_p, &symbol_pos);

        }
        else
        {
            _if_type (L2_TOKEN_IDENTIFIER)
            {
                l2_parsing_error(L2_PARSING_ERROR_TOO_FEW_PARAMETERS, current_token_p->current_line, current_token_p->current_col);
            }
            _elif_type(L2_TOKEN_RP)
            {
                l2_parsing_error(L2_PARSING_ERROR_TOO_FEW_PARAMETERS, current_token_p->current_line, current_token_p->current_col);
            }
            _else
            {
                /* symbol_pos == symbol_vec_p->size ( means real parameters list is over ) */
                /* and next token is not identifier ( means formal parameters list is over ) */
                return;
            }
        }

    }